

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O3

string * argagg::wrap_line(string *__return_storage_ptr__,string *single_line,size_t wrap_width)

{
  pointer pcVar1;
  undefined1 *puVar2;
  string *psVar3;
  long lVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  long lVar6;
  long *plVar7;
  size_type *psVar8;
  ulong uVar9;
  ulong uVar10;
  string line;
  string result;
  string indent;
  undefined1 *local_e0;
  ulong local_d8;
  undefined1 local_d0 [16];
  string local_c0;
  string local_a0;
  string *local_80;
  size_t local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  string local_50;
  
  local_78 = wrap_width;
  lVar4 = std::__cxx11::string::find_first_not_of((char *)single_line,0x10e618,0);
  if (lVar4 == -1) {
    lVar4 = 0;
  }
  local_e0 = local_d0;
  pcVar1 = (single_line->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar1,pcVar1 + single_line->_M_string_length);
  puVar2 = local_e0;
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<argagg::lstrip(std::__cxx11::string_const&)::_lambda(int)_1_>>
                    (local_e0,local_e0 + local_d8);
  uVar10 = (long)puVar2 - (long)local_e0;
  if (local_e0 + local_d8 == _Var5._M_current) {
    local_e0[uVar10] = 0;
    local_d8 = uVar10;
  }
  else {
    std::__cxx11::string::_M_erase((ulong)&local_e0,uVar10);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_80 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)lVar4);
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  lVar6 = std::__cxx11::string::find_first_of((char *)&local_e0,0x10e618,0);
  if (lVar6 != -1) {
    uVar10 = 0;
    uVar9 = 0;
    do {
      if (local_78 + uVar10 < (ulong)(lVar6 + lVar4)) {
        std::__cxx11::string::substr((ulong)&local_a0,(ulong)&local_e0);
        construct_line(&local_c0,&local_50,&local_a0);
        std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        uVar10 = uVar9;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
      }
      uVar9 = lVar6 + 1;
      lVar6 = std::__cxx11::string::find_first_of((char *)&local_e0,0x10e618,uVar9);
    } while (lVar6 != -1);
  }
  std::__cxx11::string::substr((ulong)&local_a0,(ulong)&local_e0);
  construct_line(&local_c0,&local_50,&local_a0);
  psVar3 = local_80;
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_70);
  (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar8) {
    lVar4 = plVar7[3];
    (psVar3->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&psVar3->field_2 + 8) = lVar4;
  }
  else {
    (psVar3->_M_dataplus)._M_p = (pointer)*plVar7;
    (psVar3->field_2)._M_allocated_capacity = *psVar8;
  }
  psVar3->_M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0);
  }
  return psVar3;
}

Assistant:

inline
std::string wrap_line(const std::string& single_line,
                      const std::size_t wrap_width)
{
  auto indentation_spaces = single_line.find_first_not_of(" ");
  if (indentation_spaces == std::string::npos) {
    indentation_spaces = 0;
  }

  const auto line = lstrip(single_line);
  const auto indent = std::string(indentation_spaces, ' ');

  std::string result;

  std::size_t position = 0;
  std::size_t line_start = 0;
  while (true) {
    const auto new_position = line.find_first_of(" ", position);
    if (new_position == std::string::npos) {
      break;
    }

    if (new_position + indentation_spaces > line_start + wrap_width) {
      result += construct_line(
        indent, line.substr(line_start, position - line_start - 1));

      line_start = position;
    }

    position = new_position + 1;
  }

  return result + construct_line(indent, line.substr(line_start));
}